

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_cse_conv(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  IRIns *pIVar5;
  byte bVar6;
  IRRef1 *pIVar7;
  ulong uVar8;
  
  if ((J->flags & 0x20000) != 0) {
    uVar1 = (J->fold).ins.field_0.op1;
    pIVar7 = J->chain + 0x59;
    while( true ) {
      uVar2 = *pIVar7;
      if (uVar2 <= uVar1) break;
      pIVar5 = (J->cur).ir + uVar2;
      if ((((pIVar5->field_0).op1 == uVar1) &&
          ((((pIVar5->field_0).op2 ^ (J->fold).ins.field_0.op2) & 0xfff) == 0)) &&
         (((J->fold).ins.field_1.t.irt & 0x80) <= ((pIVar5->field_1).t.irt & 0x80))) {
        return (TRef)uVar2;
      }
      pIVar7 = &(pIVar5->field_0).prev;
    }
  }
  uVar3 = (J->cur).nins;
  uVar8 = (ulong)uVar3;
  if (J->irtoplim <= uVar3) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar3 + 1;
  pIVar5 = (J->cur).ir;
  bVar6 = (J->fold).ins.field_1.o;
  *(IRRef1 *)((long)pIVar5 + uVar8 * 8 + 6) = J->chain[bVar6];
  J->chain[bVar6] = (IRRef1)uVar3;
  *(byte *)((long)pIVar5 + uVar8 * 8 + 5) = bVar6;
  pIVar5[uVar8].field_0.op1 = (J->fold).ins.field_0.op1;
  *(IRRef1 *)((long)pIVar5 + uVar8 * 8 + 2) = (J->fold).ins.field_0.op2;
  iVar4 = *(int *)((long)&(J->fold).ins + 4);
  bVar6 = (byte)iVar4;
  (J->guardemit).irt = (J->guardemit).irt | bVar6;
  *(byte *)((long)pIVar5 + uVar8 * 8 + 4) = bVar6;
  return iVar4 * 0x1000000 + uVar3;
}

Assistant:

LJFOLD(CONV any any)
LJFOLDF(cse_conv)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef op1 = fins->op1, op2 = (fins->op2 & IRCONV_MODEMASK);
    uint8_t guard = irt_isguard(fins->t);
    IRRef ref = J->chain[IR_CONV];
    while (ref > op1) {
      IRIns *ir = IR(ref);
      /* Commoning with stronger checks is ok. */
      if (ir->op1 == op1 && (ir->op2 & IRCONV_MODEMASK) == op2 &&
	  irt_isguard(ir->t) >= guard)
	return ref;
      ref = ir->prev;
    }
  }
  return EMITFOLD;  /* No fallthrough to regular CSE. */
}